

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_libc.c
# Opt level: O2

bool_t GetDatePacked(datetime_t t,datepack_t *tp,bool_t Local)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tm *ptVar3;
  time_t ot;
  
  if (t != 0 && tp != (datepack_t *)0x0) {
    ot = (time_t)(t + 0x3a4fc880);
    if (Local == 0) {
      ptVar3 = gmtime(&ot);
    }
    else {
      ptVar3 = localtime(&ot);
    }
    if (ptVar3 != (tm *)0x0) {
      tp->Second = (long)ptVar3->tm_sec;
      tp->Minute = (long)ptVar3->tm_min;
      tp->Hour = (long)ptVar3->tm_hour;
      tp->Day = (long)ptVar3->tm_mday;
      uVar1 = ptVar3->tm_mon;
      uVar2 = ptVar3->tm_year;
      *(int *)&tp->Year = uVar2 + 0x76c;
      *(uint *)((long)&tp->Year + 4) = -(uint)(uVar2 + 0x76c < 0);
      *(int *)&tp->Month = uVar1 + 1;
      *(uint *)((long)&tp->Month + 4) = -(uint)(uVar1 + 1 < 0);
      tp->WeekDay = (long)ptVar3->tm_wday + 1;
    }
    return (ulong)(ptVar3 != (tm *)0x0);
  }
  return 0;
}

Assistant:

bool_t GetDatePacked(datetime_t t, datepack_t *tp, bool_t Local)
{
	time_t ot;
	struct tm *date;

	if (!tp || t == INVALID_DATETIME_T)
        return 0;

	ot = t + DATETIME_OFFSET;
    if (Local)
        date = localtime(&ot);
    else
	    date = gmtime(&ot);

	if (date)
    {
		tp->Second = date->tm_sec;
		tp->Minute = date->tm_min;
		tp->Hour = date->tm_hour;
		tp->Day = date->tm_mday;
		tp->Month = date->tm_mon + 1;
		tp->Year = date->tm_year + 1900;
		tp->WeekDay = date->tm_wday + 1;
		return 1;
	}

	return 0;
}